

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

void __thiscall wasm::Wasm2JSBuilder::addTable(Wasm2JSBuilder *this,Ref ast,Module *wasm)

{
  uint uVar1;
  Value *pVVar2;
  char *pcVar3;
  pointer puVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  char *pcVar7;
  uintptr_t uVar8;
  size_t sVar9;
  pointer pNVar10;
  bool bVar11;
  Ref RVar12;
  Ref RVar13;
  IString *this_00;
  Value *pVVar14;
  Value *this_01;
  pointer ppEVar15;
  pointer puVar16;
  undefined1 reuse;
  char *pcVar17;
  pointer ppEVar18;
  Name *name;
  undefined1 auVar19 [8];
  void *pvVar20;
  Ref in_R8;
  Value *unaff_R14;
  ulong uVar21;
  Name name_00;
  IString target;
  IString target_00;
  Name name_01;
  string_view sVar22;
  IString name_02;
  IString op;
  IString op_00;
  undefined1 local_268 [8];
  FlatTable flat;
  string local_a0;
  Wasm2JSBuilder *local_80;
  ElementSegment *local_78;
  Value *local_70;
  Value *local_68;
  char *pcStack_60;
  Ref local_50;
  Value *local_48;
  Module *local_40;
  uint local_34;
  
  if ((wasm->tables).
      super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (wasm->tables).
      super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_80 = this;
    local_70 = ast.inst;
    local_40 = wasm;
    local_50 = cashew::ValueBuilder::makeArray();
    pVVar14 = (Value *)(local_40->tables).
                       super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    pVVar2 = (Value *)(local_40->tables).
                      super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    if (pVVar14 != pVVar2) {
      local_34 = 0;
      do {
        RVar13.inst = pVVar14;
        bVar11 = wasm::Type::isFunction((Type *)(*(long *)pVVar14 + 0x50));
        if (!bVar11) {
          Fatal::Fatal((Fatal *)local_268);
          Fatal::operator<<((Fatal *)local_268,
                            (char (*) [45])"wasm2js doesn\'t support non-function tables\n");
LAB_00ce7859:
          Fatal::~Fatal((Fatal *)local_268);
        }
        local_48 = pVVar14;
        if (((*(Table **)pVVar14)->super_Importable).module.super_IString.str._M_str == (char *)0x0)
        {
          TableUtils::FlatTable::FlatTable((FlatTable *)local_268,local_40,*(Table **)pVVar14);
          pNVar10 = flat.names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((char)flat.names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage == '\x01') {
            auVar19 = local_268;
            if (local_268 ==
                (undefined1  [8])
                flat.names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start) {
              unaff_R14 = (Value *)(ulong)local_34;
            }
            else {
              do {
                pcVar3 = DAT_010b24b8;
                if (((string_view *)auVar19)->_M_str == (char *)0x0) {
                  ((string_view *)auVar19)->_M_len = NULL_;
                  ((string_view *)auVar19)->_M_str = pcVar3;
                  sVar22 = *(string_view *)auVar19;
                }
                else {
                  name_00.super_IString.str._M_str = ((string_view *)auVar19)->_M_str;
                  name_00.super_IString.str._M_len = ((string_view *)auVar19)->_M_len;
                  sVar22 = (string_view)fromName(local_80,name_00,Top);
                  *(string_view *)auVar19 = sVar22;
                }
                pvVar20 = (void *)0x18;
                RVar13.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
                (RVar13.inst)->type = Null;
                cashew::Value::free(RVar13.inst,pvVar20);
                (RVar13.inst)->type = String;
                ((RVar13.inst)->field_1).str.str = sVar22;
                cashew::ValueBuilder::appendToArray(local_50,RVar13);
                auVar19 = (undefined1  [8])((long)auVar19 + 0x10);
              } while (auVar19 != (undefined1  [8])pNVar10);
              unaff_R14 = (Value *)(ulong)local_34;
            }
          }
          else {
            uVar1 = *(uint *)(*(long *)local_48 + 0x38);
            pvVar20 = (void *)0x18;
            pVVar14 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
            pVVar14->type = Null;
            cashew::Value::free(pVVar14,pvVar20);
            pVVar14->type = Number;
            (pVVar14->field_1).num = (double)uVar1;
            sVar22 = IString::interned((IString *)0x5,(string_view)ZEXT816(0xdbfd2b),
                                       SUB81(RVar13.inst,0));
            target.str._M_str = (char *)pVVar14;
            target.str._M_len = (size_t)sVar22._M_str;
            RVar13 = cashew::ValueBuilder::makeCall<cashew::Ref>
                               ((ValueBuilder *)sVar22._M_len,target,RVar13);
            local_50 = cashew::ValueBuilder::makeNew(RVar13);
            unaff_R14 = (Value *)CONCAT71((uint7)(uint3)(uVar1 >> 8),1);
          }
          if (local_268 != (undefined1  [8])0x0) {
            operator_delete((void *)local_268,
                            (long)flat.names.
                                  super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)local_268);
          }
        }
        else {
          unaff_R14 = (Value *)CONCAT71((int7)((ulong)unaff_R14 >> 8),1);
        }
        bVar11 = isTableExported(local_40);
        RVar13.inst = *(Value **)(*(long *)local_48 + 0x20);
        if (bVar11) {
          if (RVar13.inst != (Value *)0x0) {
            Fatal::Fatal((Fatal *)local_268);
            Fatal::operator<<((Fatal *)local_268,
                              (char (*) [68])
                              "wasm2js doesn\'t support a table that is both imported and exported\n"
                             );
            goto LAB_00ce7859;
          }
          RVar12 = cashew::ValueBuilder::makeVar(false);
          cashew::Value::push_back(local_70,RVar12);
          sVar22 = IString::interned((IString *)0x5,(string_view)ZEXT816(0xe2f263),
                                     SUB81(RVar13.inst,0));
          target_00.str._M_str = (char *)local_50.inst;
          target_00.str._M_len = (size_t)sVar22._M_str;
          RVar13 = cashew::ValueBuilder::makeCall<cashew::Ref>
                             ((ValueBuilder *)sVar22._M_len,target_00,RVar13);
LAB_00ce73fc:
          name_02.str._M_str = (char *)RVar13.inst;
          name_02.str._M_len = (size_t)DAT_010b1098;
          cashew::ValueBuilder::appendToVar
                    ((ValueBuilder *)RVar12.inst,FUNCTION_TABLE,name_02,in_R8);
        }
        else if (RVar13.inst == (Value *)0x0) {
          RVar12 = cashew::ValueBuilder::makeVar(false);
          cashew::Value::push_back(local_70,RVar12);
          RVar13.inst = local_50.inst;
          goto LAB_00ce73fc;
        }
        local_34 = (uint)unaff_R14;
        if (((ulong)unaff_R14 & 1) != 0) {
          pcVar3 = *(char **)(*(long *)local_48 + 8);
          if (pcVar3 == (char *)0x0) {
            __assert_fail("table.is() && \"Table name must not be null\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                          ,0x85,
                          "void wasm::ModuleUtils::iterTableSegments(Module &, Name, T) [T = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h:723:29)]"
                         );
          }
          puVar4 = (local_40->elementSegments).
                   super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar16 = (local_40->elementSegments).
                         super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar4;
              puVar16 = puVar16 + 1) {
            local_78 = (puVar16->_M_t).
                       super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                       .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
            if (*(char **)((long)&(local_78->table).super_IString + 8) == pcVar3) {
              pEVar5 = local_78->offset;
              bVar11 = wasm::Type::isFunction(&local_78->type);
              if (bVar11) {
                ppEVar15 = (local_78->data).
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                ppEVar18 = *(pointer *)
                            ((long)&(local_78->data).
                                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    ._M_impl + 8);
                if (ppEVar18 != ppEVar15) {
                  uVar21 = 0;
                  do {
                    pEVar6 = ppEVar15[uVar21];
                    if (pEVar6->_id == RefFuncId) {
                      pVVar14 = *(Value **)(pEVar6 + 1);
                      pcVar7 = (char *)pEVar6[1].type.id;
                      if (pEVar5->_id == GlobalGetId) {
                        uVar8 = pEVar5[1].type.id;
                        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                        pcVar17 = pcVar7;
                        local_68 = pVVar14;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_a0,uVar8,*(long *)(pEVar5 + 1) + uVar8);
                        reuse = SUB81(pcVar17,0);
                        asmangle((string *)local_268,&local_a0);
                        auVar19 = local_268;
                        this_00 = (IString *)strlen((char *)local_268);
                        sVar22._M_str = (char *)0x0;
                        sVar22._M_len = (size_t)auVar19;
                        sVar22 = IString::interned(this_00,sVar22,(bool)reuse);
                        pvVar20 = (void *)0x18;
                        pVVar14 = (Value *)MixedArena::allocSpace
                                                     ((MixedArena *)cashew::arena,0x18,8);
                        pVVar14->type = Null;
                        cashew::Value::free(pVVar14,pvVar20);
                        pVVar14->type = String;
                        (pVVar14->field_1).str.str = sVar22;
                        sVar9 = DAT_010b14a0;
                        RVar13.inst = cashew::PLUS.inst;
                        pvVar20 = (void *)0x18;
                        this_01 = (Value *)MixedArena::allocSpace
                                                     ((MixedArena *)cashew::arena,0x18,8);
                        this_01->type = Null;
                        cashew::Value::free(this_01,pvVar20);
                        this_01->type = Number;
                        (this_01->field_1).num = (double)uVar21;
                        op.str._M_str = (char *)this_01;
                        op.str._M_len = sVar9;
                        RVar13 = cashew::ValueBuilder::makeBinary
                                           ((ValueBuilder *)pVVar14,RVar13,op,in_R8);
                        if (local_268 !=
                            (undefined1  [8])
                            &flat.names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                             _M_impl.super__Vector_impl_data._M_finish) {
                          operator_delete((void *)local_268,
                                          (ulong)((long)&((flat.names.
                                                                                                                      
                                                  super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                                  super_IString).str._M_len + 1));
                        }
                        pVVar14 = local_68;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                          operator_delete(local_a0._M_dataplus._M_p,
                                          local_a0.field_2._M_allocated_capacity + 1);
                        }
                      }
                      else {
                        if (pEVar5->_id != ConstId) {
                          handle_unreachable("unexpected expr type",
                                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                                             ,0x2e1);
                        }
                        if (*(long *)(pEVar5 + 2) != 2) {
                          __assert_fail("type == Type::i32",
                                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                                        ,0x120,"int32_t wasm::Literal::geti32() const");
                        }
                        local_68 = (Value *)(double)(uint)(*(int *)(pEVar5 + 1) + (int)uVar21);
                        pvVar20 = (void *)0x18;
                        RVar13.inst = (Value *)MixedArena::allocSpace
                                                         ((MixedArena *)cashew::arena,0x18,8);
                        (RVar13.inst)->type = Null;
                        cashew::Value::free(RVar13.inst,pvVar20);
                        (RVar13.inst)->type = Number;
                        ((RVar13.inst)->field_1).num = (double)local_68;
                      }
                      local_68 = FUNCTION_TABLE.inst;
                      pcStack_60 = DAT_010b1098;
                      pvVar20 = (void *)0x18;
                      RVar12.inst = (Value *)MixedArena::allocSpace
                                                       ((MixedArena *)cashew::arena,0x18,8);
                      (RVar12.inst)->type = Null;
                      cashew::Value::free(RVar12.inst,pvVar20);
                      (RVar12.inst)->type = String;
                      ((RVar12.inst)->field_1).str.str._M_len = (size_t)local_68;
                      ((RVar12.inst)->field_1).str.str._M_str = pcStack_60;
                      local_68 = (Value *)cashew::ValueBuilder::makeSub(RVar12,RVar13);
                      sVar9 = DAT_010b1770;
                      RVar13.inst = cashew::SET.inst;
                      name_01.super_IString.str._M_str = pcVar7;
                      name_01.super_IString.str._M_len = (size_t)pVVar14;
                      sVar22 = (string_view)fromName(local_80,name_01,Top);
                      pvVar20 = (void *)0x18;
                      unaff_R14 = (Value *)MixedArena::allocSpace
                                                     ((MixedArena *)cashew::arena,0x18,8);
                      unaff_R14->type = Null;
                      cashew::Value::free(unaff_R14,pvVar20);
                      unaff_R14->type = String;
                      (unaff_R14->field_1).str.str = sVar22;
                      op_00.str._M_str = (char *)unaff_R14;
                      op_00.str._M_len = sVar9;
                      RVar13 = cashew::ValueBuilder::makeBinary(local_68,RVar13,op_00,in_R8);
                      cashew::Value::push_back(local_70,RVar13);
                      ppEVar15 = (local_78->data).
                                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                      ppEVar18 = (local_78->data).
                                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                    }
                    uVar21 = (ulong)((int)uVar21 + 1);
                  } while (uVar21 < (ulong)((long)ppEVar18 - (long)ppEVar15 >> 3));
                }
              }
            }
          }
        }
        pVVar14 = (Value *)&local_48->field_1;
      } while (pVVar14 != pVVar2);
    }
  }
  return;
}

Assistant:

void Wasm2JSBuilder::addTable(Ref ast, Module* wasm) {
  if (wasm->tables.size() == 0) {
    return;
  }

  bool perElementInit = false;

  // Emit a simple flat table as a JS array literal. Otherwise,
  // emit assignments separately for each index.
  Ref theArray = ValueBuilder::makeArray();
  for (auto& table : wasm->tables) {
    if (!table->type.isFunction()) {
      Fatal() << "wasm2js doesn't support non-function tables\n";
    }

    if (!table->imported()) {
      TableUtils::FlatTable flat(*wasm, *table);
      if (flat.valid) {
        for (auto& name : flat.names) {
          if (name.is()) {
            name = fromName(name, NameScope::Top);
          } else {
            name = NULL_;
          }
          ValueBuilder::appendToArray(theArray, ValueBuilder::makeName(name));
        }
      } else {
        perElementInit = true;
        Ref initial =
          ValueBuilder::makeInt(Address::address32_t(table->initial.addr));
        theArray = ValueBuilder::makeNew(
          ValueBuilder::makeCall(IString("Array"), initial));
      }
    } else {
      perElementInit = true;
    }

    if (isTableExported(*wasm)) {
      // If the table is exported use a fake WebAssembly.Table object
      // We don't handle the case where a table is both imported and exported.
      if (table->imported()) {
        Fatal() << "wasm2js doesn't support a table that is both imported and "
                   "exported\n";
      }
      Ref theVar = ValueBuilder::makeVar();
      ast->push_back(theVar);

      Ref table = ValueBuilder::makeCall(IString("Table"), theArray);
      ValueBuilder::appendToVar(theVar, FUNCTION_TABLE, table);
    } else if (!table->imported()) {
      // Otherwise if the table is internal (neither imported not exported).
      // Just use a plain array in this case, avoiding the Table.
      Ref theVar = ValueBuilder::makeVar();
      ast->push_back(theVar);
      ValueBuilder::appendToVar(theVar, FUNCTION_TABLE, theArray);
    }

    if (perElementInit) {
      // TODO: optimize for size
      ModuleUtils::iterTableSegments(
        *wasm, table->name, [&](ElementSegment* segment) {
          auto offset = segment->offset;
          ElementUtils::iterElementSegmentFunctionNames(
            segment, [&](Name entry, Index i) {
              Ref index;
              if (auto* c = offset->dynCast<Const>()) {
                index = ValueBuilder::makeInt(c->value.geti32() + i);
              } else if (auto* get = offset->dynCast<GlobalGet>()) {
                index = ValueBuilder::makeBinary(
                  ValueBuilder::makeName(
                    stringToIString(asmangle(get->name.toString()))),
                  PLUS,
                  ValueBuilder::makeNum(i));
              } else {
                WASM_UNREACHABLE("unexpected expr type");
              }
              ast->push_back(
                ValueBuilder::makeStatement(ValueBuilder::makeBinary(
                  ValueBuilder::makeSub(ValueBuilder::makeName(FUNCTION_TABLE),
                                        index),
                  SET,
                  ValueBuilder::makeName(fromName(entry, NameScope::Top)))));
            });
        });
    }
  }
}